

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksLoader.cpp
# Opt level: O3

Expected<Talks> * cppti::TalksLoader::loadFrom(Expected<Talks> *__return_storage_ptr__,istream *ifs)

{
  json json;
  vector<cppti::Talk,_std::allocator<cppti::Talk>_> local_a8;
  undefined1 local_88 [8];
  json_value local_80;
  vector<cppti::Talk,_std::allocator<cppti::Talk>_> local_78 [2];
  vector<cppti::Talk,_std::allocator<cppti::Talk>_> local_48;
  
  local_88[0] = null;
  local_80.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_88);
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nlohmann::operator>>
            (ifs,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_0>
            (local_78,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_88);
  local_48.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78[0].super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78[0].super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78[0].super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78[0].super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78[0].super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0].super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector(&local_48);
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector(local_78);
  *(pointer *)
   &(__return_storage_ptr__->
    super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    ).
    super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
    .
    super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
    .field_0 = local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
               super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           ).
           super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
           .
           super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
           .field_0 + 8) =
       local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           ).
           super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
           .
           super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
           .
           super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
           .field_0 + 0x10) =
       local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<cppti::Talk,_std::allocator<cppti::Talk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  ).
  super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  .
  super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  .
  super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
  .
  super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
  .
  super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
  .m_has_val = true;
  std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>::~vector(&local_a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_88 + 8),local_88[0]);
  return __return_storage_ptr__;
}

Assistant:

Expected<Talks> TalksLoader::loadFrom(std::istream& ifs)
{
  auto json = nlohmann::json{};
  auto talks = Talks{};

  try
  {
    ifs >> json;
    talks = json.get<Talks>();
  }
  catch (nlohmann::json::exception const& e)
  {
    return tl::unexpected{ErrContext{ErrCode::DB_INVALID_FORMAT, e.what()}};
  }
  return talks;
}